

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::verifyTextureBindings(TextureCubeMapArrayGetterCalls *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  float fVar6;
  MessageBuilder local_4b8;
  MessageBuilder local_338;
  MessageBuilder local_1a8;
  undefined4 local_28;
  float local_24;
  GLint int_value;
  GLfloat float_value;
  float epsilon;
  GLboolean bool_value;
  Functions *gl;
  TextureCubeMapArrayGetterCalls *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _epsilon = CONCAT44(extraout_var,iVar1);
  float_value._3_1_ = '\0';
  int_value = 0x3727c5ac;
  local_24 = 0.0;
  local_28 = 0;
  (**(code **)(_epsilon + 0x798))(0x900a,(long)&float_value + 3);
  dVar2 = (**(code **)(_epsilon + 0x800))();
  glu::checkError(dVar2,"glGetBooleanv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1ab);
  if (((this->m_to_id == 0) && (float_value._3_1_ != '\0')) ||
     ((this->m_to_id != 0 && (float_value._3_1_ != '\x01')))) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [90])
                        "glGetBooleanv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this->m_test_passed = '\0';
  }
  (**(code **)(_epsilon + 0x818))(0x900a,&local_24);
  dVar2 = (**(code **)(_epsilon + 0x800))();
  glu::checkError(dVar2,"glGetFloatv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1b8);
  fVar6 = de::abs<float>(local_24 - (float)this->m_to_id);
  if (1e-05 < fVar6) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_338,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_338,
                        (char (*) [88])
                        "glGetFloatv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_338);
    this->m_test_passed = '\0';
  }
  (**(code **)(_epsilon + 0x868))(0x900a,&local_28);
  dVar2 = (**(code **)(_epsilon + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
                  ,0x1c4);
  fVar6 = de::abs<float>(local_24 - (float)this->m_to_id);
  if (1e-05 < fVar6) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4b8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_4b8,
                        (char (*) [90])
                        "glGetIntegerv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
                       );
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
    this->m_test_passed = '\0';
  }
  return;
}

Assistant:

void TextureCubeMapArrayGetterCalls::verifyTextureBindings(void)
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	glw::GLboolean		  bool_value  = GL_FALSE;
	const float			  epsilon	 = 1e-5f;
	glw::GLfloat		  float_value = 0.0f;
	glw::GLint			  int_value   = 0;

	/* Check glGetBooleanv() reports a correct value */
	gl.getBooleanv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if ((m_to_id == 0 && bool_value != GL_FALSE) || (m_to_id != 0 && bool_value != GL_TRUE))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glGetBooleanv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
			<< tcu::TestLog::EndMessage;
		m_test_passed = false;
	}

	/* Check glGetFloatv() reports a correct value */
	gl.getFloatv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if (de::abs(float_value - static_cast<float>(m_to_id)) > epsilon)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetFloatv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
						   << tcu::TestLog::EndMessage;
		m_test_passed = false;
	}

	/* Check glGetIntegerv() reports a correct value */
	gl.getIntegerv(GL_TEXTURE_BINDING_CUBE_MAP_ARRAY, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname");

	if (de::abs(float_value - static_cast<float>(m_to_id)) > epsilon)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "glGetIntegerv() reported an invalid value for GL_TEXTURE_BINDING_CUBE_MAP_ARRAY_EXT pname"
			<< tcu::TestLog::EndMessage;
		m_test_passed = false;
	}
}